

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void setup_trace_path(char *path)

{
  int *piVar1;
  char *path_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    usage_exit(2);
  }
  piVar1 = __errno_location();
  *piVar1 = 0;
  trace_file = (FILE *)fopen(path,"w");
  if ((FILE *)trace_file == (FILE *)0x0) {
    perror("Unable to write trace");
    exit(1);
  }
  return;
}

Assistant:

static void setup_trace_path(const char *path)
{
    if (path == nullptr or path[0] == 0) {
        usage_exit(2);
    }
    errno = 0;
    trace_file = fopen(path, "w");
    if (trace_file == nullptr) {
        perror("Unable to write trace");
        exit(1);
    }
}